

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O2

int Fraig_BitStringCountOnes(uint *pString,int nWords)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)(nWords << 2);
  if (nWords << 2 < 1) {
    uVar3 = uVar2;
  }
  iVar1 = 0;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    iVar1 = iVar1 + bit_count[*(byte *)((long)pString + uVar2)];
  }
  return iVar1;
}

Assistant:

int Fraig_BitStringCountOnes( unsigned * pString, int nWords )
{
    unsigned char * pSuppBytes = (unsigned char *)pString;
    int i, nOnes, nBytes = sizeof(unsigned) * nWords;
    // count the number of ones in the simulation vector
    for ( i = nOnes = 0; i < nBytes; i++ )
        nOnes += bit_count[pSuppBytes[i]];
    return nOnes;
}